

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obu.c
# Opt level: O0

void copy_decoded_tile_to_tile_list_buffer
               (AV1Decoder *pbi,int tile_idx,int tile_width_in_pixels,int tile_height_in_pixels)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int vend1_00;
  int iVar6;
  int hstart2_00;
  int iVar7;
  int vstart1_00;
  int vend1_01;
  int hstart1_00;
  int hstart1_01;
  int hend1_00;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int hstart2;
  int vstart2;
  int hend1;
  int hstart1;
  int vend1;
  int vstart1;
  int w;
  int h;
  int shift_y;
  int shift_x;
  int plane;
  int tc;
  int tr;
  YV12_BUFFER_CONFIG *cur_frame;
  int num_planes;
  int ssx;
  int ssy;
  AV1_COMMON *cm;
  uint uVar8;
  undefined4 local_44;
  
  uVar1 = *(uint *)(*(long *)(in_RDI + 0x9be8) + 100);
  iVar2 = *(int *)(*(long *)(in_RDI + 0x9be8) + 0x60);
  iVar6 = av1_num_planes((AV1_COMMON *)(in_RDI + 0x3b60));
  lVar5 = *(long *)(in_RDI + 0x3c48);
  iVar3 = *(int *)(in_RDI + 0x58de0);
  iVar4 = *(int *)(in_RDI + 0x58de0);
  for (local_44 = 0; local_44 < iVar6; local_44 = local_44 + 1) {
    uVar8 = uVar1;
    vend1_00 = iVar2;
    if (local_44 < 1) {
      uVar8 = 0;
      vend1_00 = 0;
    }
    hstart2_00 = in_ECX >> ((byte)uVar8 & 0x1f);
    iVar7 = in_EDX >> ((byte)vend1_00 & 0x1f);
    vstart1_00 = *(int *)(in_RDI + 0x58da0) * hstart2_00;
    vend1_01 = vstart1_00 + hstart2_00;
    hstart1_00 = *(int *)(in_RDI + 0x58da4) * iVar7;
    hstart1_01 = hstart1_00 + iVar7;
    hend1_00 = (in_ESI / (iVar3 + 1)) * hstart2_00;
    iVar7 = (in_ESI % (iVar4 + 1)) * iVar7;
    if ((*(char *)(*(long *)(in_RDI + 0x9be8) + 0x4c) == '\0') ||
       (*(int *)(*(long *)(in_RDI + 0x9be8) + 0x48) != 8)) {
      if (local_44 == 0) {
        aom_yv12_partial_copy_y_c
                  ((YV12_BUFFER_CONFIG *)CONCAT44(vend1_01,hstart1_00),hstart1_01,hend1_00,iVar7,
                   vend1_00,(YV12_BUFFER_CONFIG *)((ulong)uVar8 << 0x20),hstart2_00,vend1_00);
      }
      else if (local_44 == 1) {
        aom_yv12_partial_copy_u_c
                  ((YV12_BUFFER_CONFIG *)CONCAT44(vend1_01,hstart1_00),hstart1_01,hend1_00,iVar7,
                   vend1_00,(YV12_BUFFER_CONFIG *)CONCAT44(uVar8,1),hstart2_00,vend1_00);
      }
      else if (local_44 == 2) {
        aom_yv12_partial_copy_v_c
                  ((YV12_BUFFER_CONFIG *)CONCAT44(vend1_01,hstart1_00),hstart1_01,hend1_00,iVar7,
                   vend1_00,(YV12_BUFFER_CONFIG *)CONCAT44(uVar8,2),hstart2_00,vend1_00);
      }
    }
    else {
      yv12_tile_copy((YV12_BUFFER_CONFIG *)(lVar5 + 0x4e0),hstart1_00,hstart1_01,vstart1_00,vend1_01
                     ,(YV12_BUFFER_CONFIG *)(in_RDI + 0x5f600),iVar7,hend1_00,local_44);
    }
  }
  return;
}

Assistant:

static void copy_decoded_tile_to_tile_list_buffer(AV1Decoder *pbi, int tile_idx,
                                                  int tile_width_in_pixels,
                                                  int tile_height_in_pixels) {
  AV1_COMMON *const cm = &pbi->common;
  const int ssy = cm->seq_params->subsampling_y;
  const int ssx = cm->seq_params->subsampling_x;
  const int num_planes = av1_num_planes(cm);

  YV12_BUFFER_CONFIG *cur_frame = &cm->cur_frame->buf;
  const int tr = tile_idx / (pbi->output_frame_width_in_tiles_minus_1 + 1);
  const int tc = tile_idx % (pbi->output_frame_width_in_tiles_minus_1 + 1);
  int plane;

  // Copy decoded tile to the tile list output buffer.
  for (plane = 0; plane < num_planes; ++plane) {
    const int shift_x = plane > 0 ? ssx : 0;
    const int shift_y = plane > 0 ? ssy : 0;
    const int h = tile_height_in_pixels >> shift_y;
    const int w = tile_width_in_pixels >> shift_x;

    // src offset
    int vstart1 = pbi->dec_tile_row * h;
    int vend1 = vstart1 + h;
    int hstart1 = pbi->dec_tile_col * w;
    int hend1 = hstart1 + w;
    // dst offset
    int vstart2 = tr * h;
    int hstart2 = tc * w;

    if (cm->seq_params->use_highbitdepth &&
        cm->seq_params->bit_depth == AOM_BITS_8) {
      yv12_tile_copy(cur_frame, hstart1, hend1, vstart1, vend1,
                     &pbi->tile_list_outbuf, hstart2, vstart2, plane);
    } else {
      switch (plane) {
        case 0:
          aom_yv12_partial_copy_y(cur_frame, hstart1, hend1, vstart1, vend1,
                                  &pbi->tile_list_outbuf, hstart2, vstart2);
          break;
        case 1:
          aom_yv12_partial_copy_u(cur_frame, hstart1, hend1, vstart1, vend1,
                                  &pbi->tile_list_outbuf, hstart2, vstart2);
          break;
        case 2:
          aom_yv12_partial_copy_v(cur_frame, hstart1, hend1, vstart1, vend1,
                                  &pbi->tile_list_outbuf, hstart2, vstart2);
          break;
        default: assert(0);
      }
    }
  }
}